

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_prepare_transfer(connectdata *conn)

{
  Curl_easy *pCVar1;
  anon_union_264_12_f950f0f9_for_proto *pp;
  char *local_40;
  ftp_conn *ftpc;
  Curl_easy *data;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  if (*(int *)((long)(conn->data->req).protop + 0x10) == 0) {
    if ((*(ulong *)&(pCVar1->set).field_0x978 >> 0xe & 1) == 0) {
      if ((*(ulong *)&(pCVar1->set).field_0x978 >> 0x11 & 1) == 0) {
        ftp._4_4_ = ftp_state_use_pasv(conn);
      }
      else {
        pp = &conn->proto;
        if ((conn->proto).ftpc.file == (char *)0x0) {
          if ((pCVar1->set).str[6] == (char *)0x0) {
            local_40 = "LIST";
            if ((*(ulong *)&(pCVar1->set).field_0x978 >> 0xd & 1) != 0) {
              local_40 = "NLST";
            }
          }
          else {
            local_40 = (pCVar1->set).str[6];
          }
          ftp._4_4_ = Curl_pp_sendf(&(pp->ftpc).pp,"PRET %s",local_40);
        }
        else if ((*(ulong *)&(pCVar1->set).field_0x978 >> 0x1d & 1) == 0) {
          ftp._4_4_ = Curl_pp_sendf(&(pp->ftpc).pp,"PRET RETR %s",(conn->proto).ftpc.file);
        }
        else {
          ftp._4_4_ = Curl_pp_sendf(&(pp->ftpc).pp,"PRET STOR %s",(conn->proto).ftpc.file);
        }
        if (ftp._4_4_ == CURLE_OK) {
          _state(conn,FTP_PRET);
        }
      }
    }
    else {
      ftp._4_4_ = ftp_state_use_port(conn,EPRT);
    }
  }
  else {
    _state(conn,FTP_RETR_PREQUOTE);
    ftp._4_4_ = ftp_state_quote(conn,true,FTP_RETR_PREQUOTE);
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_prepare_transfer(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = conn->data->req.protop;
  struct Curl_easy *data = conn->data;

  if(ftp->transfer != FTPTRANSFER_BODY) {
    /* doesn't transfer any data */

    /* still possibly do PRE QUOTE jobs */
    state(conn, FTP_RETR_PREQUOTE);
    result = ftp_state_quote(conn, TRUE, FTP_RETR_PREQUOTE);
  }
  else if(data->set.ftp_use_port) {
    /* We have chosen to use the PORT (or similar) command */
    result = ftp_state_use_port(conn, EPRT);
  }
  else {
    /* We have chosen (this is default) to use the PASV (or similar) command */
    if(data->set.ftp_use_pret) {
      /* The user has requested that we send a PRET command
         to prepare the server for the upcoming PASV */
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      if(!conn->proto.ftpc.file)
        result = Curl_pp_sendf(&ftpc->pp, "PRET %s",
                               data->set.str[STRING_CUSTOMREQUEST]?
                               data->set.str[STRING_CUSTOMREQUEST]:
                               (data->set.ftp_list_only?"NLST":"LIST"));
      else if(data->set.upload)
        result = Curl_pp_sendf(&ftpc->pp, "PRET STOR %s",
                               conn->proto.ftpc.file);
      else
        result = Curl_pp_sendf(&ftpc->pp, "PRET RETR %s",
                               conn->proto.ftpc.file);
      if(!result)
        state(conn, FTP_PRET);
    }
    else
      result = ftp_state_use_pasv(conn);
  }
  return result;
}